

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::ComputeSolutionHCurlT<double>
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<double> *sol,TPZSolVec<double> *curlSol)

{
  double dVar1;
  uint uVar2;
  TPZManVector<double,_10> *pTVar3;
  TNode *pTVar4;
  int iVar5;
  long *plVar6;
  TPZCompMesh *pTVar7;
  TPZFMatrix<double> *this_00;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long iSol;
  long col;
  long lVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  double local_68;
  TPZCompMesh *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  TPZFMatrix<double> *local_40;
  long local_38;
  
  local_40 = phiHCurl;
  plVar6 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))();
  (**(code **)(*plVar6 + 0x78))(plVar6);
  iVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  pTVar7 = TPZCompEl::Mesh((TPZCompEl *)this);
  this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar7->fSolution);
  lVar11 = (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  (*(sol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(sol,lVar11);
  (*(curlSol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(curlSol);
  lVar10 = 0;
  local_38 = lVar11;
  if (lVar11 < 1) {
    lVar11 = lVar10;
    local_38 = lVar10;
  }
  while (lVar11 != 0) {
    pTVar3 = (sol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
    (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar10 + -0x20) + 0x18))
              ((long)pTVar3->fExtAlloc + lVar10 + -0x20,1);
    local_68 = 0.0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((sol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
               lVar10 + -0x20),&local_68,0,-1);
    pTVar3 = (curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
    (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar10 + -0x20) + 0x18))
              ((long)pTVar3->fExtAlloc + lVar10 + -0x20,1);
    local_68 = 0.0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
               lVar10 + -0x20),&local_68,0,-1);
    lVar10 = lVar10 + 0x70;
    lVar11 = lVar11 + -1;
  }
  local_60 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  lVar11 = 0;
  for (iVar12 = 0; iVar12 != iVar5; iVar12 = iVar12 + 1) {
    lVar10 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                    super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                    super_TPZCompEl + 0xa8))();
    pTVar4 = (local_60->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
    uVar2 = pTVar4[*(int *)(lVar10 + 8)].dim;
    local_58 = (long)pTVar4[*(int *)(lVar10 + 8)].pos;
    lVar11 = (long)(int)lVar11;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    local_50 = (ulong)uVar2;
    uVar9 = 0;
    while (uVar9 != local_50) {
      lVar10 = uVar9 + local_58;
      lVar13 = 8;
      local_48 = uVar9;
      for (col = 0; local_38 != col; col = col + 1) {
        pdVar8 = TPZFMatrix<double>::operator()(this_00,lVar10,col);
        dVar1 = *pdVar8;
        dVar14 = TPZFMatrix<double>::operator()(local_40,lVar11,0);
        pdVar8 = *(double **)
                  ((long)((sol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                  lVar13 + -0x20);
        *pdVar8 = dVar14 * dVar1 + *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(this_00,lVar10,col);
        dVar1 = *pdVar8;
        (*(curlPhi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x21])(curlPhi,0,lVar11);
        pdVar8 = *(double **)
                  ((long)((curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                  lVar13 + -0x20);
        *pdVar8 = extraout_XMM0_Qa * dVar1 + *pdVar8;
        lVar13 = lVar13 + 0x70;
      }
      lVar11 = lVar11 + 1;
      uVar9 = local_48 + 1;
    }
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}